

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chull.cpp
# Opt level: O2

void masc::polygon::updateHullTop
               (ply_vertex *v,
               list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull
               )

{
  _List_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  Point2d *p1;
  Point2d *p2;
  undefined4 extraout_var;
  _Self __tmp;
  _Self __tmp_1;
  
  while( true ) {
    if ((hull->
        super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>)
        ._M_impl._M_node._M_size == 1) {
      return;
    }
    p_Var1 = (hull->
             super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
             )._M_impl._M_node.super__List_node_base._M_prev;
    p1 = (Point2d *)(*(code *)(p_Var1->_M_prev[1]._M_next)->_M_next[1]._M_next)();
    p2 = (Point2d *)(*(code *)(p_Var1[1]._M_next)->_M_next[1]._M_next)();
    iVar3 = (*v->_vptr_ply_vertex[2])(v);
    bVar2 = turn_left(p1,p2,(Point2d *)CONCAT44(extraout_var,iVar3));
    if (bVar2) break;
    std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::
    pop_back(hull);
  }
  return;
}

Assistant:

inline void updateHullTop(ply_vertex * v,list<ply_vertex*>& hull)
{
    typedef list<ply_vertex*>::iterator VIT;
    if( hull.size()==1 ) return;
    VIT l1=hull.end(); l1--;
    VIT l2=l1; l2--;
    if( turn_left((*l2)->getPos(),(*l1)->getPos(),v->getPos()) )
        return;
    hull.pop_back();
    updateHullTop(v,hull);
}